

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t farmhash64_uo_with_seed(char *s,size_t len,uint64_t seed)

{
  uint64_t uVar1;
  ulong in_RSI;
  uint64_t in_stack_000000c0;
  uint64_t in_stack_000000c8;
  size_t in_stack_000000d0;
  char *in_stack_000000d8;
  size_t in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  if (in_RSI < 0x41) {
    uVar1 = farmhash64_na_with_seed(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x2b401f);
  }
  else {
    uVar1 = farmhash64_uo_with_seeds
                      (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  }
  return uVar1;
}

Assistant:

uint64_t farmhash64_uo_with_seed(const char *s, size_t len, uint64_t seed) {
  return len <= 64 ? farmhash64_na_with_seed(s, len, seed) :
      farmhash64_uo_with_seeds(s, len, 0, seed);
}